

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int b;
  int c;
  int in_stack_ffffffffffffffd8;
  OpCode in_stack_ffffffffffffffdc;
  int iVar1;
  
  if (in_ECX == -1) {
    in_ECX = 0;
  }
  if ((in_EDX + -1) / 0x32 + 1 < 0x200) {
    luaK_codeABC((FuncState *)CONCAT44(in_ECX,in_ECX),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,0,0x1180b0);
  }
  else {
    iVar1 = in_ECX;
    luaK_codeABC((FuncState *)CONCAT44(in_ECX,in_ECX),in_stack_ffffffffffffffdc,
                 in_stack_ffffffffffffffd8,0,0x1180cc);
    luaK_code((FuncState *)CONCAT44(iVar1,in_ECX),in_stack_ffffffffffffffdc,
              in_stack_ffffffffffffffd8);
  }
  *(int *)(in_RDI + 0x3c) = in_ESI + 1;
  return;
}

Assistant:

static void luaK_setlist(FuncState*fs,int base,int nelems,int tostore){
int c=(nelems-1)/50+1;
int b=(tostore==(-1))?0:tostore;
if(c<=((1<<9)-1))
luaK_codeABC(fs,OP_SETLIST,base,b,c);
else{
luaK_codeABC(fs,OP_SETLIST,base,b,0);
luaK_code(fs,cast(Instruction,c),fs->ls->lastline);
}
fs->freereg=base+1;
}